

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O0

SUNAdaptController SUNAdaptController_ImExGus(SUNContext_conflict sunctx)

{
  SUNAdaptController C_00;
  SUNAdaptController C_01;
  undefined8 in_RDI;
  SUNAdaptControllerContent_ImExGus content;
  SUNAdaptController C;
  SUNContext_conflict sunctx_local_scope_;
  
  C_00 = (SUNAdaptController)SUNAdaptController_NewEmpty(in_RDI);
  C_00->ops->gettype = SUNAdaptController_GetType_ImExGus;
  C_00->ops->estimatestep = SUNAdaptController_EstimateStep_ImExGus;
  C_00->ops->reset = SUNAdaptController_Reset_ImExGus;
  C_00->ops->setdefaults = SUNAdaptController_SetDefaults_ImExGus;
  C_00->ops->write = SUNAdaptController_Write_ImExGus;
  C_00->ops->seterrorbias = SUNAdaptController_SetErrorBias_ImExGus;
  C_00->ops->updateh = SUNAdaptController_UpdateH_ImExGus;
  C_00->ops->space = SUNAdaptController_Space_ImExGus;
  C_01 = (SUNAdaptController)malloc(0x40);
  C_00->content = C_01;
  SUNAdaptController_SetDefaults_ImExGus(C_01);
  SUNAdaptController_Reset_ImExGus(C_00);
  return C_00;
}

Assistant:

SUNAdaptController SUNAdaptController_ImExGus(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  SUNAdaptController C;
  SUNAdaptControllerContent_ImExGus content;

  /* Create an empty controller object */
  C = NULL;
  C = SUNAdaptController_NewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  C->ops->gettype      = SUNAdaptController_GetType_ImExGus;
  C->ops->estimatestep = SUNAdaptController_EstimateStep_ImExGus;
  C->ops->reset        = SUNAdaptController_Reset_ImExGus;
  C->ops->setdefaults  = SUNAdaptController_SetDefaults_ImExGus;
  C->ops->write        = SUNAdaptController_Write_ImExGus;
  C->ops->seterrorbias = SUNAdaptController_SetErrorBias_ImExGus;
  C->ops->updateh      = SUNAdaptController_UpdateH_ImExGus;
  C->ops->space        = SUNAdaptController_Space_ImExGus;

  /* Create content */
  content = NULL;
  content = (SUNAdaptControllerContent_ImExGus)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  C->content = content;

  /* Fill content with default/reset values */
  SUNCheckCallNull(SUNAdaptController_SetDefaults_ImExGus(C));
  SUNCheckCallNull(SUNAdaptController_Reset_ImExGus(C));

  return (C);
}